

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O2

ostream * operator<<(ostream *os,KmerCounter *kc)

{
  ostream *poVar1;
  allocator local_61;
  string local_60 [32];
  string local_40;
  
  poVar1 = std::operator<<(os,"KmerCounter ");
  if ((kc->name)._M_string_length == 0) {
    std::__cxx11::string::string(local_60,"unnamed",&local_61);
  }
  else {
    std::__cxx11::string::string(local_60,(string *)&kc->name);
  }
  poVar1 = std::operator<<(poVar1,local_60);
  poVar1 = std::operator<<(poVar1,": index with ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  std::__cxx11::to_string(&local_40,(int)kc->k);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,"-mers");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string(local_60);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const KmerCounter &kc) {
    os << "KmerCounter "<< ( kc.name.empty() ? "unnamed":kc.name ) <<": index with "<<kc.kindex.size()<<" "<<std::to_string(kc.k)<<"-mers";
    return os;
}